

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.hpp
# Opt level: O3

void re::math::normalize<float,_1l,_1l>(span<const_float,__1L> in,span<float,__1L> out)

{
  float fVar1;
  long lVar2;
  extent_type<_1L> eVar3;
  float fVar4;
  
  eVar3 = in.storage_.super_extent_type<_1L>.size_;
  if (eVar3.size_ != out.storage_.super_extent_type<_1L>.size_.size_) {
    __assert_fail("std::size(in) == std::size(out)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/include/re/lib/math/normalize.hpp"
                  ,0x10,
                  "void re::math::normalize(gsl::span<const T, N_in>, gsl::span<T, N_out>) [T = float, N_in = -1L, N_out = -1L]"
                 );
  }
  if (eVar3.size_ != 0) {
    fVar4 = 0.0;
    lVar2 = 0;
    do {
      fVar1 = in.storage_.data_[lVar2];
      if (fVar1 <= 0.0) {
        fVar1 = 0.0;
      }
      fVar4 = fVar1 + fVar4;
      lVar2 = lVar2 + 1;
    } while (eVar3.size_ != lVar2);
    if (fVar4 < 0.0) {
      __assert_fail("sum >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/include/re/lib/math/normalize.hpp"
                    ,0x1a,
                    "void re::math::normalize(gsl::span<const T, N_in>, gsl::span<T, N_out>) [T = float, N_in = -1L, N_out = -1L]"
                   );
    }
    lVar2 = 0;
    do {
      out.storage_.data_[lVar2] = in.storage_.data_[lVar2] / fVar4;
      lVar2 = lVar2 + 1;
    } while (eVar3.size_ != lVar2);
  }
  return;
}

Assistant:

void
normalize(gsl::span<T const, N_in> in, gsl::span<T, N_out> out)
noexcept {
    assert(std::size(in) == std::size(out));
    auto sum = std::accumulate(
        std::cbegin(in),
        std::cend(in),
        static_cast<T>(0),
        [] (const auto result, const auto value) {
            return result + std::fmax(value, 0);
        }
    );

    assert(sum >= 0);
    std::transform(
        std::cbegin(in),
        std::cend(in),
        std::begin(out),
        [sum] (auto v) {
            return v / sum;
        }
    );
}